

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lobject.c
# Opt level: O2

char * luaO_pushvfstring(lua_State *L,char *fmt,__va_list_tag *argp)

{
  char cVar1;
  uint uVar2;
  undefined8 uVar3;
  GCObject *pGVar4;
  lua_State *plVar5;
  int iVar6;
  char *pcVar7;
  long *plVar8;
  undefined1 *puVar9;
  undefined1 (*__s) [32];
  int *piVar10;
  Value *pVVar11;
  unsigned_long *puVar12;
  size_t slen;
  size_t slen_00;
  undefined8 *puVar13;
  char *__s_00;
  undefined1 auVar14 [32];
  char c;
  undefined7 uStack_1e7;
  char local_1e0 [8];
  lua_State *local_1d8;
  BuffFS buff;
  
  buff.pushed = 0;
  buff.blen = 0;
  local_1d8 = L;
  buff.L = L;
  do {
    pcVar7 = strchr(fmt,0x25);
    if (pcVar7 == (char *)0x0) {
      slen_00 = strlen(fmt);
      addstr2buff(&buff,fmt,slen_00);
      clearbuff(&buff);
      plVar5 = local_1d8;
      if (1 < buff.pushed) {
        luaV_concat(local_1d8,buff.pushed);
      }
      if ((plVar5->top[-1].tt_ & 0xf) == 4) {
        pGVar4 = plVar5->top[-1].value_.gc;
        if ((pGVar4->tt & 0xf) == 4) {
          return (char *)&pGVar4[1].tt;
        }
        pcVar7 = "(((((L->top - 1)->value_).gc)->tt) & 0x0F) == 4";
      }
      else {
        pcVar7 = "(((((((L->top - 1))->tt_)) & 0x0F)) == (4))";
      }
      __assert_fail(pcVar7,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lobject.c"
                    ,0x22c,
                    "const char *luaO_pushvfstring(lua_State *, const char *, struct __va_list_tag *)"
                   );
    }
    addstr2buff(&buff,fmt,(long)pcVar7 - (long)fmt);
    cVar1 = pcVar7[1];
    if (cVar1 == '%') {
      __s_00 = "%";
LAB_0011c5f1:
      slen = 1;
LAB_0011c6b9:
      addstr2buff(&buff,__s_00,slen);
    }
    else if (cVar1 == 'I') {
      uVar2 = argp->gp_offset;
      if ((ulong)uVar2 < 0x29) {
        pVVar11 = (Value *)((ulong)uVar2 + (long)argp->reg_save_area);
        argp->gp_offset = uVar2 + 8;
      }
      else {
        pVVar11 = (Value *)argp->overflow_arg_area;
        argp->overflow_arg_area = pVVar11 + 1;
      }
      _c = *pVVar11;
LAB_0011c6cf:
      local_1e0[0] = '\x13';
      local_1e0[1] = '\0';
LAB_0011c6da:
      addnum2buff(&buff,(TValue *)&c);
    }
    else {
      if (cVar1 == 'U') {
        uVar2 = argp->gp_offset;
        if ((ulong)uVar2 < 0x29) {
          puVar12 = (unsigned_long *)((ulong)uVar2 + (long)argp->reg_save_area);
          argp->gp_offset = uVar2 + 8;
        }
        else {
          puVar12 = (unsigned_long *)argp->overflow_arg_area;
          argp->overflow_arg_area = puVar12 + 1;
        }
        iVar6 = luaO_utf8esc(&c,*puVar12);
        slen = (size_t)iVar6;
        __s_00 = local_1e0 + -slen;
        goto LAB_0011c6b9;
      }
      if (cVar1 == 'c') {
        uVar2 = argp->gp_offset;
        if ((ulong)uVar2 < 0x29) {
          puVar9 = (undefined1 *)((ulong)uVar2 + (long)argp->reg_save_area);
          argp->gp_offset = uVar2 + 8;
        }
        else {
          puVar9 = (undefined1 *)argp->overflow_arg_area;
          argp->overflow_arg_area = puVar9 + 8;
        }
        c = *puVar9;
        __s_00 = &c;
        goto LAB_0011c5f1;
      }
      if (cVar1 == 'd') {
        uVar2 = argp->gp_offset;
        if ((ulong)uVar2 < 0x29) {
          piVar10 = (int *)((ulong)uVar2 + (long)argp->reg_save_area);
          argp->gp_offset = uVar2 + 8;
        }
        else {
          piVar10 = (int *)argp->overflow_arg_area;
          argp->overflow_arg_area = piVar10 + 2;
        }
        _c = (Value)(long)*piVar10;
        goto LAB_0011c6cf;
      }
      if (cVar1 == 'f') {
        uVar2 = argp->fp_offset;
        if ((ulong)uVar2 < 0xa1) {
          pVVar11 = (Value *)((ulong)uVar2 + (long)argp->reg_save_area);
          argp->fp_offset = uVar2 + 0x10;
        }
        else {
          pVVar11 = (Value *)argp->overflow_arg_area;
          argp->overflow_arg_area = pVVar11 + 1;
        }
        _c = *pVVar11;
        local_1e0[0] = '\x03';
        local_1e0[1] = '\0';
        goto LAB_0011c6da;
      }
      if (cVar1 != 'p') {
        if (cVar1 != 's') {
          luaG_runerror(local_1d8,"invalid option \'%%%c\' to \'lua_pushfstring\'",
                        (ulong)(uint)(int)cVar1);
        }
        uVar2 = argp->gp_offset;
        if ((ulong)uVar2 < 0x29) {
          plVar8 = (long *)((ulong)uVar2 + (long)argp->reg_save_area);
          argp->gp_offset = uVar2 + 8;
        }
        else {
          plVar8 = (long *)argp->overflow_arg_area;
          argp->overflow_arg_area = plVar8 + 1;
        }
        __s_00 = (char *)*plVar8;
        if (__s_00 == (char *)0x0) {
          __s_00 = "(null)";
        }
        slen = strlen(__s_00);
        goto LAB_0011c6b9;
      }
      __s = (undefined1 (*) [32])getbuff(&buff,0x20);
      uVar2 = argp->gp_offset;
      if ((ulong)uVar2 < 0x29) {
        puVar13 = (undefined8 *)((ulong)uVar2 + (long)argp->reg_save_area);
        argp->gp_offset = uVar2 + 8;
      }
      else {
        puVar13 = (undefined8 *)argp->overflow_arg_area;
        argp->overflow_arg_area = puVar13 + 1;
      }
      auVar14[8] = 0xab;
      auVar14._0_8_ = 0xabababababababab;
      auVar14[9] = 0xab;
      auVar14[10] = 0xab;
      auVar14[0xb] = 0xab;
      auVar14[0xc] = 0xab;
      auVar14[0xd] = 0xab;
      auVar14[0xe] = 0xab;
      auVar14[0xf] = 0xab;
      auVar14[0x10] = 0xab;
      auVar14[0x11] = 0xab;
      auVar14[0x12] = 0xab;
      auVar14[0x13] = 0xab;
      auVar14[0x14] = 0xab;
      auVar14[0x15] = 0xab;
      auVar14[0x16] = 0xab;
      auVar14[0x17] = 0xab;
      auVar14[0x18] = 0xab;
      auVar14[0x19] = 0xab;
      auVar14[0x1a] = 0xab;
      auVar14[0x1b] = 0xab;
      auVar14[0x1c] = 0xab;
      auVar14[0x1d] = 0xab;
      auVar14[0x1e] = 0xab;
      auVar14[0x1f] = 0xab;
      uVar3 = *puVar13;
      *__s = auVar14;
      iVar6 = snprintf((char *)__s,0x20,"%p",uVar3);
      buff.blen = buff.blen + iVar6;
    }
    fmt = pcVar7 + 2;
  } while( true );
}

Assistant:

const char *luaO_pushvfstring (lua_State *L, const char *fmt, va_list argp) {
  BuffFS buff;  /* holds last part of the result */
  const char *e;  /* points to next '%' */
  buff.pushed = buff.blen = 0;
  buff.L = L;
  while ((e = strchr(fmt, '%')) != NULL) {
    addstr2buff(&buff, fmt, e - fmt);  /* add 'fmt' up to '%' */
    switch (*(e + 1)) {  /* conversion specifier */
      case 's': {  /* zero-terminated string */
        const char *s = va_arg(argp, char *);
        if (s == NULL) s = "(null)";
        addstr2buff(&buff, s, strlen(s));
        break;
      }
      case 'c': {  /* an 'int' as a character */
        char c = cast_uchar(va_arg(argp, int));
        addstr2buff(&buff, &c, sizeof(char));
        break;
      }
      case 'd': {  /* an 'int' */
        TValue num;
        setivalue(&num, va_arg(argp, int));
        addnum2buff(&buff, &num);
        break;
      }
      case 'I': {  /* a 'lua_Integer' */
        TValue num;
        setivalue(&num, cast(lua_Integer, va_arg(argp, l_uacInt)));
        addnum2buff(&buff, &num);
        break;
      }
      case 'f': {  /* a 'lua_Number' */
        TValue num;
        setfltvalue(&num, cast_num(va_arg(argp, l_uacNumber)));
        addnum2buff(&buff, &num);
        break;
      }
      case 'p': {  /* a pointer */
        const int sz = 3 * sizeof(void*) + 8; /* enough space for '%p' */
        char *bf = getbuff(&buff, sz);
        void *p = va_arg(argp, void *);
        int len = lua_pointer2str(bf, sz, p);
        addsize(&buff, len);
        break;
      }
      case 'U': {  /* a 'long' as a UTF-8 sequence */
        char bf[UTF8BUFFSZ];
        int len = luaO_utf8esc(bf, va_arg(argp, long));
        addstr2buff(&buff, bf + UTF8BUFFSZ - len, len);
        break;
      }
      case '%': {
        addstr2buff(&buff, "%", 1);
        break;
      }
      default: {
        luaG_runerror(L, "invalid option '%%%c' to 'lua_pushfstring'",
                         *(e + 1));
      }
    }
    fmt = e + 2;  /* skip '%' and the specifier */
  }
  addstr2buff(&buff, fmt, strlen(fmt));  /* rest of 'fmt' */
  clearbuff(&buff);  /* empty buffer into the stack */
  if (buff.pushed > 1)
    luaV_concat(L, buff.pushed);  /* join all partial results */
  return svalue(L->top - 1);
}